

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O3

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseSysex(MidiStreamParserImpl *this,Bit8u *stream,Bit32u length)

{
  byte bVar1;
  bool bVar2;
  Bit32u BVar3;
  size_t __n;
  ulong uVar4;
  
  __n = (size_t)(length + (length == 0));
  uVar4 = 0;
  do {
    if (__n - 1 == uVar4) goto LAB_0011180f;
    bVar1 = stream[uVar4 + 1];
    uVar4 = uVar4 + 1;
  } while (-1 < (char)bVar1);
  if (bVar1 == 0xf7) {
    uVar4 = (ulong)((int)uVar4 + 1);
    (*this->midiReceiver->_vptr_MidiReceiver[1])(this->midiReceiver,stream,uVar4);
  }
  else {
    if (0xf7 < bVar1) {
      __n = uVar4 & 0xffffffff;
LAB_0011180f:
      BVar3 = (Bit32u)__n;
      this->streamBufferSize = BVar3;
      bVar2 = checkStreamBufferCapacity(this,false);
      if (bVar2) {
        memcpy(this->streamBuffer,stream,__n);
        return BVar3;
      }
      *this->streamBuffer = *stream;
      this->streamBufferSize = this->streamBufferCapacity;
      return BVar3;
    }
    (**this->midiReporter->_vptr_MidiReporter)
              (this->midiReporter,"parseSysex: SysEx message lacks end-of-sysex (0xf7), ignored");
  }
  return (Bit32u)uVar4;
}

Assistant:

Bit32u MidiStreamParserImpl::parseSysex(const Bit8u stream[], const Bit32u length) {
	// Find SysEx length
	Bit32u sysexLength = 1;
	while (sysexLength < length) {
		Bit8u nextByte = stream[sysexLength++];
		if (0x80 <= nextByte) {
			if (nextByte == 0xF7) {
				// End of SysEx
				midiReceiver.handleSysex(stream, sysexLength);
				return sysexLength;
			}
			if (0xF8 <= nextByte) {
				// The System Realtime message must be processed right after return
				// but the SysEx is actually fragmented and to be reconstructed in streamBuffer
				--sysexLength;
				break;
			}
			// Illegal status byte in SysEx message, aborting
			midiReporter.printDebug("parseSysex: SysEx message lacks end-of-sysex (0xf7), ignored");
			// Continue parsing from that point
			return sysexLength - 1;
		}
	}

	// Store incomplete SysEx message for further processing
	streamBufferSize = sysexLength;
	if (checkStreamBufferCapacity(false)) {
		memcpy(streamBuffer, stream, sysexLength);
	} else {
		// Not enough buffer capacity, don't care about the real buffer content, just mark the first byte
		*streamBuffer = *stream;
		streamBufferSize = streamBufferCapacity;
	}
	return sysexLength;
}